

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
dlib::
add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>
::update_parameters<dlib::sgd>
          (add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>
           *this,sstack<dlib::sgd> solvers,double learning_rate)

{
  uint *puVar1;
  double dVar2;
  sgd *this_00;
  ostream *poVar3;
  fatal_error *this_01;
  ostringstream dlib_o_out;
  sstack<dlib::sgd> local_1c8;
  string local_1b8;
  long local_198 [3];
  uint auStack_180 [88];
  
  local_1c8.mysize = solvers.mysize;
  local_1c8.data = solvers.data;
  if (local_1c8.mysize != 0) {
    if (((this->params_grad).super_tensor.m_size != 0) &&
       ((dVar2 = (this->details).learning_rate_multiplier, dVar2 != 0.0 || (NAN(dVar2))))) {
      this_00 = sstack<dlib::sgd>::top(&local_1c8);
      sgd::update_considering_bias<dlib::con_<256l,1l,1l,1,1,0,0>>
                (this_00,(float)learning_rate,&this->details,&(this->params_grad).super_tensor,
                 (this->params_grad).super_tensor.m_size - (this->details).num_filters_);
      tt::add((tensor *)this,(tensor *)this,(tensor *)this_00);
    }
    sstack<dlib::sgd>::pop(&local_1c8,1);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"\n\nError detected at line ",0x19);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,0x3ed);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/core.h"
             ,0x78);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "void dlib::add_layer<dlib::con_<256, 1, 1, 1, 1>, dlib::add_tag_layer<1, dlib::impl::repeat_input_layer>>::update_parameters(sstack<solver_type>, double) [LAYER_DETAILS = dlib::con_<256, 1, 1, 1, 1>, SUBNET = dlib::add_tag_layer<1, dlib::impl::repeat_input_layer>, enabled = void, solver_type = dlib::sgd]"
             ,0x131);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"solvers.size()>=num_computational_layers",0x28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".\n",2);
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"",0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  this_01 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_01,EBROKEN_ASSERT,&local_1b8);
  __cxa_throw(this_01,&fatal_error::typeinfo,error::~error);
}

Assistant:

void update_parameters(sstack<solver_type> solvers, double learning_rate)
        {
            DLIB_CASSERT(solvers.size()>=num_computational_layers);
            // Don't try to adjust the parameters if this layer doesn't have any or the
            // learning rate is disabled for this layer.
            if (params_grad.size() != 0 && get_learning_rate_multiplier(details) != 0)
            {
                const tensor& step = solvers.top()(learning_rate, details, static_cast<const tensor&>(params_grad));
                tt::add(details.get_layer_params(), details.get_layer_params(), step);
            }
            subnetwork->update_parameters(solvers.pop(), learning_rate);
        }